

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yocto_obj.h
# Opt level: O0

yo_scene * yo__load_mtl(yo_scene *scene,char *filename)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  float fVar3;
  yo__vec3f yVar4;
  undefined8 local_1148;
  float local_1140;
  undefined8 local_1128;
  float local_1120;
  undefined8 local_1108;
  float local_1100;
  undefined8 local_10e8;
  float local_10e0;
  undefined8 local_10c8;
  float local_10c0;
  undefined8 local_10a8;
  float local_10a0;
  yo_material *pyStack_1088;
  int mntok;
  yo_material *mat;
  char *pcStack_1078;
  int mlinenum;
  char *mtok [10];
  char mline [4096];
  FILE *mfile;
  char *filename_local;
  yo_scene *scene_local;
  
  __stream = fopen(filename,"rt");
  if (__stream == (FILE *)0x0) {
    scene_local = (yo_scene *)0x0;
  }
  else {
    pyStack_1088 = (yo_material *)0x0;
    while (pcVar2 = fgets((char *)(mtok + 9),0x1000,__stream), pcVar2 != (char *)0x0) {
      iVar1 = yo__splitws((char *)(mtok + 9),&stack0xffffffffffffef88,10);
      if (((iVar1 != 0) && (*pcStack_1078 != '#')) && (*pcStack_1078 != '/')) {
        iVar1 = strcmp(pcStack_1078,"newmtl");
        if (iVar1 == 0) {
          yo__add_empty_material(scene,mtok[0]);
          pyStack_1088 = scene->materials + (scene->nmaterials + -1);
        }
        else {
          iVar1 = strcmp(pcStack_1078,"illum");
          if (iVar1 == 0) {
            iVar1 = atoi(mtok[0]);
            pyStack_1088->illum = iVar1;
          }
          else {
            iVar1 = strcmp(pcStack_1078,"Ke");
            if (iVar1 == 0) {
              yVar4 = yo__parse_float3(mtok);
              local_10a8 = yVar4._0_8_;
              local_10a0 = yVar4.z;
              *(undefined8 *)pyStack_1088->ke = local_10a8;
              pyStack_1088->ke[2] = local_10a0;
            }
            else {
              iVar1 = strcmp(pcStack_1078,"Ka");
              if (iVar1 == 0) {
                yVar4 = yo__parse_float3(mtok);
                local_10c8 = yVar4._0_8_;
                local_10c0 = yVar4.z;
                *(undefined8 *)pyStack_1088->ka = local_10c8;
                pyStack_1088->ka[2] = local_10c0;
              }
              else {
                iVar1 = strcmp(pcStack_1078,"Kd");
                if (iVar1 == 0) {
                  yVar4 = yo__parse_float3(mtok);
                  local_10e8 = yVar4._0_8_;
                  local_10e0 = yVar4.z;
                  *(undefined8 *)pyStack_1088->kd = local_10e8;
                  pyStack_1088->kd[2] = local_10e0;
                }
                else {
                  iVar1 = strcmp(pcStack_1078,"Ks");
                  if (iVar1 == 0) {
                    yVar4 = yo__parse_float3(mtok);
                    local_1108 = yVar4._0_8_;
                    local_1100 = yVar4.z;
                    *(undefined8 *)pyStack_1088->ks = local_1108;
                    pyStack_1088->ks[2] = local_1100;
                  }
                  else {
                    iVar1 = strcmp(pcStack_1078,"Kr");
                    if (iVar1 == 0) {
                      yVar4 = yo__parse_float3(mtok);
                      local_1128 = yVar4._0_8_;
                      local_1120 = yVar4.z;
                      *(undefined8 *)pyStack_1088->kr = local_1128;
                      pyStack_1088->kr[2] = local_1120;
                    }
                    else {
                      iVar1 = strcmp(pcStack_1078,"Tr");
                      if (iVar1 == 0) {
                        yVar4 = yo__parse_float3(mtok);
                        local_1148 = yVar4._0_8_;
                        local_1140 = yVar4.z;
                        *(undefined8 *)pyStack_1088->kt = local_1148;
                        pyStack_1088->kt[2] = local_1140;
                      }
                      else {
                        iVar1 = strcmp(pcStack_1078,"Ns");
                        if (iVar1 == 0) {
                          fVar3 = yo__parse_float(mtok);
                          pyStack_1088->ns = fVar3;
                        }
                        else {
                          iVar1 = strcmp(pcStack_1078,"d");
                          if (iVar1 == 0) {
                            fVar3 = yo__parse_float(mtok);
                            pyStack_1088->op = fVar3;
                          }
                          else {
                            iVar1 = strcmp(pcStack_1078,"Tr");
                            if (iVar1 == 0) {
                              fVar3 = yo__parse_float(mtok);
                              pyStack_1088->op = fVar3;
                            }
                            else {
                              iVar1 = strcmp(pcStack_1078,"Ni");
                              if (iVar1 == 0) {
                                fVar3 = yo__parse_float(mtok);
                                pyStack_1088->ior = fVar3;
                              }
                              else {
                                iVar1 = strcmp(pcStack_1078,"map_Ke");
                                if (iVar1 == 0) {
                                  pcVar2 = yo__strdup(mtok[0]);
                                  pyStack_1088->ke_txt = pcVar2;
                                }
                                else {
                                  iVar1 = strcmp(pcStack_1078,"map_Ka");
                                  if (iVar1 == 0) {
                                    pcVar2 = yo__strdup(mtok[0]);
                                    pyStack_1088->ka_txt = pcVar2;
                                  }
                                  else {
                                    iVar1 = strcmp(pcStack_1078,"map_Kd");
                                    if (iVar1 == 0) {
                                      pcVar2 = yo__strdup(mtok[0]);
                                      pyStack_1088->kd_txt = pcVar2;
                                    }
                                    else {
                                      iVar1 = strcmp(pcStack_1078,"map_Ks");
                                      if (iVar1 == 0) {
                                        pcVar2 = yo__strdup(mtok[0]);
                                        pyStack_1088->ks_txt = pcVar2;
                                      }
                                      else {
                                        iVar1 = strcmp(pcStack_1078,"map_Kr");
                                        if (iVar1 == 0) {
                                          pcVar2 = yo__strdup(mtok[0]);
                                          pyStack_1088->kr_txt = pcVar2;
                                        }
                                        else {
                                          iVar1 = strcmp(pcStack_1078,"map_Tr");
                                          if (iVar1 == 0) {
                                            pcVar2 = yo__strdup(mtok[0]);
                                            pyStack_1088->kt_txt = pcVar2;
                                          }
                                          else {
                                            iVar1 = strcmp(pcStack_1078,"map_Ns");
                                            if (iVar1 == 0) {
                                              pcVar2 = yo__strdup(mtok[0]);
                                              pyStack_1088->ns_txt = pcVar2;
                                            }
                                            else {
                                              iVar1 = strcmp(pcStack_1078,"map_d");
                                              if (iVar1 == 0) {
                                                pcVar2 = yo__strdup(mtok[0]);
                                                pyStack_1088->op_txt = pcVar2;
                                              }
                                              else {
                                                iVar1 = strcmp(pcStack_1078,"map_Tr");
                                                if (iVar1 == 0) {
                                                  pcVar2 = yo__strdup(mtok[0]);
                                                  pyStack_1088->op_txt = pcVar2;
                                                }
                                                else {
                                                  iVar1 = strcmp(pcStack_1078,"map_Ni");
                                                  if (iVar1 == 0) {
                                                    pcVar2 = yo__strdup(mtok[0]);
                                                    pyStack_1088->ior_txt = pcVar2;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(pcStack_1078,"map_bump");
                                                    if (iVar1 == 0) {
                                                      pcVar2 = yo__strdup(mtok[0]);
                                                      pyStack_1088->bump_txt = pcVar2;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(pcStack_1078,"map_disp");
                                                      if (iVar1 == 0) {
                                                        pcVar2 = yo__strdup(mtok[0]);
                                                        pyStack_1088->disp_txt = pcVar2;
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    fclose(__stream);
    scene_local = scene;
  }
  return scene_local;
}

Assistant:

static inline yo_scene*
yo__load_mtl(yo_scene* scene, const char* filename) {
    FILE* mfile = fopen(filename, "rt");
    if (!mfile) return 0;

    char mline[4096];
    char* mtok[10];
    int mlinenum = 0;

    yo_material* mat = 0;

    // foreach line, splits the line by whitespaces and parses the data
    // directly in the material
    while (fgets(mline, 4096, mfile)) {
        mlinenum += 1;
        int mntok = yo__splitws(mline, mtok, 10);

        if (!mntok) {
            continue;
        } else if (mtok[0][0] == '#' || mtok[0][0] == '/') {
            continue;
        } else if (!strcmp(mtok[0], "newmtl")) {
            yo__add_empty_material(scene, mtok[1]);
            mat = &scene->materials[scene->nmaterials - 1];
        } else if (!strcmp(mtok[0], "illum")) {
            mat->illum = atoi(mtok[1]);
        } else if (!strcmp(mtok[0], "Ke")) {
            *(yo__vec3f*)mat->ke = yo__parse_float3(mtok + 1);
        } else if (!strcmp(mtok[0], "Ka")) {
            *(yo__vec3f*)mat->ka = yo__parse_float3(mtok + 1);
        } else if (!strcmp(mtok[0], "Kd")) {
            *(yo__vec3f*)mat->kd = yo__parse_float3(mtok + 1);
        } else if (!strcmp(mtok[0], "Ks")) {
            *(yo__vec3f*)mat->ks = yo__parse_float3(mtok + 1);
        } else if (!strcmp(mtok[0], "Kr")) {
            *(yo__vec3f*)mat->kr = yo__parse_float3(mtok + 1);
        } else if (!strcmp(mtok[0], "Tr")) {
            *(yo__vec3f*)mat->kt = yo__parse_float3(mtok + 1);
        } else if (!strcmp(mtok[0], "Ns")) {
            mat->ns = yo__parse_float(mtok + 1);
        } else if (!strcmp(mtok[0], "d")) {
            mat->op = yo__parse_float(mtok + 1);
        } else if (!strcmp(mtok[0], "Tr")) {
            mat->op = yo__parse_float(mtok + 1);
        } else if (!strcmp(mtok[0], "Ni")) {
            mat->ior = yo__parse_float(mtok + 1);
        } else if (!strcmp(mtok[0], "map_Ke")) {
            mat->ke_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Ka")) {
            mat->ka_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Kd")) {
            mat->kd_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Ks")) {
            mat->ks_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Kr")) {
            mat->kr_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Tr")) {
            mat->kt_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Ns")) {
            mat->ns_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_d")) {
            mat->op_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Tr")) {
            mat->op_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Ni")) {
            mat->ior_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_bump")) {
            mat->bump_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_disp")) {
            mat->disp_txt = yo__strdup(mtok[1]);
        } else {
            // printf("ignoring value for %s\n", mtok[0]);
        }
    }

    fclose(mfile);

    return scene;
}